

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

int Wlc_PrsFindDefinition(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pXValue)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  char *pLine;
  int Beg;
  int End;
  int t;
  int shift;
  char *pClose_2;
  int Signed;
  int Range;
  char *pClose_1;
  char *pClose;
  int fRotating;
  int Type;
  char *pName;
  int *pXValue_local;
  Vec_Int_t *vFanins_local;
  char *pStr_local;
  Wlc_Prs_t *p_local;
  
  pClose._4_4_ = 0;
  pClose._0_4_ = 0;
  pName = (char *)pXValue;
  pXValue_local = &vFanins->nCap;
  vFanins_local = (Vec_Int_t *)pStr;
  pStr_local = (char *)p;
  Vec_IntClear(vFanins);
  vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)vFanins_local);
  if ((char)vFanins_local->nCap != '=') {
    return 0;
  }
  vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)((long)&vFanins_local->nCap + 1));
  if ((char)vFanins_local->nCap == '(') {
    pcVar4 = Wlc_PrsFindSymbolTwo((char *)vFanins_local,'>','>');
    if ((pcVar4 == (char *)0x0) ||
       (pcVar4 = Wlc_PrsFindSymbolTwo((char *)vFanins_local,'<','<'), pcVar4 == (char *)0x0)) {
      _Signed = Wlc_PrsFindClosingParenthesis((char *)vFanins_local,'(',')');
      if (_Signed == (char *)0x0) {
        iVar2 = Wlc_PrsWriteErrorMessage
                          ((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                           "Expecting closing parenthesis.");
        return iVar2;
      }
      *_Signed = ' ';
      *(undefined1 *)&vFanins_local->nCap = 0x20;
      vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)vFanins_local);
    }
    else {
      pClose_1 = Wlc_PrsFindClosingParenthesis((char *)vFanins_local,'(',')');
      if (pClose_1 == (char *)0x0) {
        iVar2 = Wlc_PrsWriteErrorMessage
                          ((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                           "Expecting closing parenthesis.");
        return iVar2;
      }
      *(undefined1 *)&vFanins_local->nCap = 0x20;
      *pClose_1 = '\0';
      vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)vFanins_local);
      pClose._0_4_ = 1;
    }
  }
  iVar2 = Wlc_PrsIsDigit((char *)vFanins_local);
  if (iVar2 == 0) {
    if (((char)vFanins_local->nCap == '!') ||
       ((((((char)vFanins_local->nCap == '~' && (*(char *)((long)&vFanins_local->nCap + 1) != '&'))
          && (*(char *)((long)&vFanins_local->nCap + 1) != '|')) &&
         (*(char *)((long)&vFanins_local->nCap + 1) != '^')) ||
        (((char)vFanins_local->nCap == '@' || ((char)vFanins_local->nCap == '#')))))) {
      if ((char)vFanins_local->nCap == '!') {
        pClose._4_4_ = 0x1a;
      }
      else if ((char)vFanins_local->nCap == '~') {
        pClose._4_4_ = 0xf;
      }
      else if ((char)vFanins_local->nCap == '@') {
        pClose._4_4_ = 0x33;
      }
      else {
        if ((char)vFanins_local->nCap != '#') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                        ,0x2d2,"int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)")
          ;
        }
        pClose._4_4_ = 0x34;
      }
      vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)((long)&vFanins_local->nCap + 1));
      if ((char)vFanins_local->nCap == '(') {
        _t = Wlc_PrsFindClosingParenthesis((char *)vFanins_local,'(',')');
        if (_t == (char *)0x0) {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                             "Expecting closing parenthesis.");
          return iVar2;
        }
        *_t = ' ';
        *(undefined1 *)&vFanins_local->nCap = 0x20;
      }
      vFanins_local =
           (Vec_Int_t *)
           Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,(Vec_Int_t *)pXValue_local)
      ;
      if (vFanins_local == (Vec_Int_t *)0x0) {
        iVar2 = Wlc_PrsWriteErrorMessage
                          ((Wlc_Prs_t *)pStr_local,(char *)0x0,"Cannot read name after !.");
        return iVar2;
      }
    }
    else if (((((((char)vFanins_local->nCap == '-') || ((char)vFanins_local->nCap == '&')) ||
               (((char)vFanins_local->nCap == '|' || ((char)vFanins_local->nCap == '^')))) ||
              (((char)vFanins_local->nCap == '~' &&
               (*(char *)((long)&vFanins_local->nCap + 1) == '&')))) ||
             (((char)vFanins_local->nCap == '~' &&
              (*(char *)((long)&vFanins_local->nCap + 1) == '|')))) ||
            (((char)vFanins_local->nCap == '~' && (*(char *)((long)&vFanins_local->nCap + 1) == '^')
             ))) {
      End = 1;
      if ((char)vFanins_local->nCap == '-') {
        pClose._4_4_ = 0x32;
      }
      else if ((char)vFanins_local->nCap == '&') {
        pClose._4_4_ = 0x25;
      }
      else if ((char)vFanins_local->nCap == '|') {
        pClose._4_4_ = 0x26;
      }
      else if ((char)vFanins_local->nCap == '^') {
        pClose._4_4_ = 0x27;
      }
      else {
        if (((char)vFanins_local->nCap == '~') && (*(char *)((long)&vFanins_local->nCap + 1) == '&')
           ) {
          pClose._4_4_ = 0x28;
        }
        else if (((char)vFanins_local->nCap == '~') &&
                (*(char *)((long)&vFanins_local->nCap + 1) == '|')) {
          pClose._4_4_ = 0x29;
        }
        else {
          if (((char)vFanins_local->nCap != '~') ||
             (*(char *)((long)&vFanins_local->nCap + 1) != '^')) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                          ,0x2f4,
                          "int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)");
          }
          pClose._4_4_ = 0x2a;
        }
        End = 2;
      }
      vFanins_local =
           (Vec_Int_t *)
           Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)((long)&vFanins_local->nCap + (long)End),
                           (Vec_Int_t *)pXValue_local);
      if (vFanins_local == (Vec_Int_t *)0x0) {
        iVar2 = Wlc_PrsWriteErrorMessage
                          ((Wlc_Prs_t *)pStr_local,(char *)0x0,
                           "Cannot read name after a unary operator.");
        return iVar2;
      }
    }
    else if ((char)vFanins_local->nCap == '{') {
      pcVar4 = Wlc_PrsFindSymbol((char *)((long)&vFanins_local->nCap + 1),'{');
      if (pcVar4 == (char *)0x0) {
        while( true ) {
          vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)((long)&vFanins_local->nCap + 1));
          vFanins_local =
               (Vec_Int_t *)
               Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                               (Vec_Int_t *)pXValue_local);
          if (vFanins_local == (Vec_Int_t *)0x0) {
            iVar2 = Wlc_PrsWriteErrorMessage
                              ((Wlc_Prs_t *)pStr_local,(char *)0x0,
                               "Cannot read name in concatenation.");
            return iVar2;
          }
          if ((char)vFanins_local->nCap == '}') break;
          if ((char)vFanins_local->nCap != ',') {
            iVar2 = Wlc_PrsWriteErrorMessage
                              ((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                               "Expected comma (,) in this place.");
            return iVar2;
          }
        }
        pClose._4_4_ = 0x17;
      }
      else {
        pcVar4 = Wlc_PrsFindSymbol((char *)((long)&vFanins_local->nCap + 1),'\'');
        if (pcVar4 == (char *)0x0) {
          pClose._4_4_ = 0x19;
        }
        else {
          pClose._4_4_ = 0x18;
        }
        vFanins_local = (Vec_Int_t *)Wlc_PrsFindSymbol((char *)((long)&vFanins_local->nCap + 1),',')
        ;
        if (vFanins_local == (Vec_Int_t *)0x0) {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)0x0,"Expecting one comma in this line."
                            );
          return iVar2;
        }
        vFanins_local =
             (Vec_Int_t *)
             Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)((long)&vFanins_local->nCap + 1),
                             (Vec_Int_t *)pXValue_local);
        if (vFanins_local == (Vec_Int_t *)0x0) {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)0x0,
                             "Cannot read name in sign-extension.");
          return iVar2;
        }
        vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)vFanins_local);
        if ((char)vFanins_local->nCap != '}') {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                             "There is no closing brace (}).");
          return iVar2;
        }
      }
      if ((char)vFanins_local->nCap != '}') {
        __assert_fail("pStr[0] == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                      ,0x318,"int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)");
      }
      vFanins_local = (Vec_Int_t *)((long)&vFanins_local->nCap + 1);
    }
    else {
      pVVar5 = (Vec_Int_t *)
               Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                               (Vec_Int_t *)pXValue_local);
      if (pVVar5 == (Vec_Int_t *)0x0) {
        return 0;
      }
      vFanins_local = pVVar5;
      if ((char)pVVar5->nCap == '\0') {
        pClose._4_4_ = 7;
      }
      else if ((char)pVVar5->nCap == '?') {
        vFanins_local =
             (Vec_Int_t *)
             Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)((long)&pVVar5->nCap + 1),
                             (Vec_Int_t *)pXValue_local);
        if (vFanins_local == (Vec_Int_t *)0x0) {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)0x0,"Cannot read name in MUX.");
          return iVar2;
        }
        if ((char)vFanins_local->nCap != ':') {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                             "MUX lacks the colon symbol (:).");
          return iVar2;
        }
        vFanins_local =
             (Vec_Int_t *)
             Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)((long)&vFanins_local->nCap + 1),
                             (Vec_Int_t *)pXValue_local);
        if (vFanins_local == (Vec_Int_t *)0x0) {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)0x0,"Cannot read name in MUX.");
          return iVar2;
        }
        iVar2 = Vec_IntSize((Vec_Int_t *)pXValue_local);
        if (iVar2 != 3) {
          __assert_fail("Vec_IntSize(vFanins) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                        ,0x32a,"int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)")
          ;
        }
        piVar6 = Vec_IntArray((Vec_Int_t *)pXValue_local);
        Beg = piVar6[1];
        piVar6 = Vec_IntArray((Vec_Int_t *)pXValue_local);
        iVar2 = piVar6[2];
        piVar6 = Vec_IntArray((Vec_Int_t *)pXValue_local);
        iVar1 = Beg;
        piVar6[1] = iVar2;
        piVar6 = Vec_IntArray((Vec_Int_t *)pXValue_local);
        piVar6[2] = iVar1;
        pClose._4_4_ = 8;
      }
      else if ((char)pVVar5->nCap == '[') {
        vFanins_local =
             (Vec_Int_t *)Wlc_PrsFindRange((char *)pVVar5,(int *)((long)&pLine + 4),(int *)&pLine);
        if (vFanins_local == (Vec_Int_t *)0x0) {
          iVar2 = Wlc_PrsWriteErrorMessage
                            ((Wlc_Prs_t *)pStr_local,(char *)pVVar5,"Non-standard range.");
          return iVar2;
        }
        Vec_IntPushTwo((Vec_Int_t *)pXValue_local,pLine._4_4_,(int)pLine);
        pClose._4_4_ = 0x16;
      }
      else {
        if ((((char)pVVar5->nCap == '>') && (*(char *)((long)&pVVar5->nCap + 1) == '>')) &&
           (*(char *)((long)&pVVar5->nCap + 2) != '>')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 9;
          if ((int)pClose != 0) {
            pClose._4_4_ = 0xd;
          }
        }
        else if ((((char)pVVar5->nCap == '>') && (*(char *)((long)&pVVar5->nCap + 1) == '>')) &&
                (*(char *)((long)&pVVar5->nCap + 2) == '>')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 3);
          pClose._4_4_ = 10;
        }
        else if ((((char)pVVar5->nCap == '<') && (*(char *)((long)&pVVar5->nCap + 1) == '<')) &&
                (*(char *)((long)&pVVar5->nCap + 2) != '<')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0xb;
          if ((int)pClose != 0) {
            pClose._4_4_ = 0xe;
          }
        }
        else if ((((char)pVVar5->nCap == '<') && (*(char *)((long)&pVVar5->nCap + 1) == '<')) &&
                (*(char *)((long)&pVVar5->nCap + 2) == '<')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 3);
          pClose._4_4_ = 0xc;
        }
        else if (((char)pVVar5->nCap == '&') && (*(char *)((long)&pVVar5->nCap + 1) != '&')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x10;
        }
        else if (((char)pVVar5->nCap == '|') && (*(char *)((long)&pVVar5->nCap + 1) != '|')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x11;
        }
        else if (((char)pVVar5->nCap == '^') && (*(char *)((long)&pVVar5->nCap + 1) != '^')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x12;
        }
        else if (((char)pVVar5->nCap == '~') && (*(char *)((long)&pVVar5->nCap + 1) == '&')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x13;
        }
        else if (((char)pVVar5->nCap == '~') && (*(char *)((long)&pVVar5->nCap + 1) == '|')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x14;
        }
        else if (((char)pVVar5->nCap == '~') && (*(char *)((long)&pVVar5->nCap + 1) == '^')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x15;
        }
        else if (((char)pVVar5->nCap == '=') && (*(char *)((long)&pVVar5->nCap + 1) == '>')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x1b;
        }
        else if (((char)pVVar5->nCap == '&') && (*(char *)((long)&pVVar5->nCap + 1) == '&')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x1c;
        }
        else if (((char)pVVar5->nCap == '|') && (*(char *)((long)&pVVar5->nCap + 1) == '|')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x1d;
        }
        else if (((char)pVVar5->nCap == '^') && (*(char *)((long)&pVVar5->nCap + 1) == '^')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x1e;
        }
        else if (((char)pVVar5->nCap == '=') && (*(char *)((long)&pVVar5->nCap + 1) == '=')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x1f;
        }
        else if (((char)pVVar5->nCap == '!') && (*(char *)((long)&pVVar5->nCap + 1) == '=')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x20;
        }
        else if (((char)pVVar5->nCap == '<') && (*(char *)((long)&pVVar5->nCap + 1) != '=')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x21;
        }
        else if (((char)pVVar5->nCap == '>') && (*(char *)((long)&pVVar5->nCap + 1) != '=')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x22;
        }
        else if (((char)pVVar5->nCap == '<') && (*(char *)((long)&pVVar5->nCap + 1) == '=')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x23;
        }
        else if (((char)pVVar5->nCap == '>') && (*(char *)((long)&pVVar5->nCap + 1) == '=')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x24;
        }
        else if ((char)pVVar5->nCap == '+') {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x2b;
        }
        else if ((char)pVVar5->nCap == '-') {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x2c;
        }
        else if (((char)pVVar5->nCap == '*') && (*(char *)((long)&pVVar5->nCap + 1) != '*')) {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x2d;
        }
        else if ((char)pVVar5->nCap == '/') {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x2e;
        }
        else if ((char)pVVar5->nCap == '%') {
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 1);
          pClose._4_4_ = 0x2f;
        }
        else {
          if (((char)pVVar5->nCap != '*') || (*(char *)((long)&pVVar5->nCap + 1) != '*')) {
            iVar2 = Wlc_PrsWriteErrorMessage
                              ((Wlc_Prs_t *)pStr_local,(char *)pVVar5,"Unsupported operation (%c).",
                               (ulong)(uint)(int)(char)pVVar5->nCap);
            return iVar2;
          }
          vFanins_local = (Vec_Int_t *)((long)&pVVar5->nCap + 2);
          pClose._4_4_ = 0x31;
        }
        vFanins_local =
             (Vec_Int_t *)
             Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)((long)&vFanins_local->nCap + 1),
                             (Vec_Int_t *)pXValue_local);
        if (vFanins_local == (Vec_Int_t *)0x0) {
          return 0;
        }
        vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)vFanins_local);
        if ((pClose._4_4_ == 0x2b) && ((char)vFanins_local->nCap == '+')) {
          vFanins_local =
               (Vec_Int_t *)
               Wlc_PrsReadName((Wlc_Prs_t *)pStr_local,(char *)((long)&vFanins_local->nCap + 1),
                               (Vec_Int_t *)pXValue_local);
          if (vFanins_local == (Vec_Int_t *)0x0) {
            return 0;
          }
          vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces((char *)vFanins_local);
        }
        pVVar5 = vFanins_local;
        if ((char)vFanins_local->nCap != '\0') {
          uVar3 = Wlc_PrsFindLine((Wlc_Prs_t *)pStr_local,(char *)vFanins_local);
          printf("Warning: Trailing symbols \"%s\" in line %d.\n",pVVar5,(ulong)uVar3);
        }
      }
    }
  }
  else {
    vFanins_local =
         (Vec_Int_t *)
         Wlc_PrsReadConstant((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                             (Vec_Int_t *)pXValue_local,(int *)((long)&pClose_2 + 4),
                             (int *)&pClose_2,(int *)pName);
    if (vFanins_local == (Vec_Int_t *)0x0) {
      return 0;
    }
    pClose._4_4_ = 6;
  }
  if ((vFanins_local == (Vec_Int_t *)0x0) ||
     (vFanins_local = (Vec_Int_t *)Wlc_PrsFindName((char *)vFanins_local,(char **)&fRotating),
     vFanins_local == (Vec_Int_t *)0x0)) {
    p_local._4_4_ = pClose._4_4_;
  }
  else {
    p_local._4_4_ =
         Wlc_PrsWriteErrorMessage
                   ((Wlc_Prs_t *)pStr_local,(char *)vFanins_local,
                    "Name %s is left at the end of the line.",_fRotating);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Wlc_PrsFindDefinition( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pXValue )
{
    char * pName;
    int Type = WLC_OBJ_NONE;
    int fRotating = 0;
    Vec_IntClear( vFanins );
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '=' )
        return 0;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( pStr[0] == '(' )
    {
        // consider rotating shifter
        if ( Wlc_PrsFindSymbolTwo(pStr, '>', '>') && Wlc_PrsFindSymbolTwo(pStr, '<', '<') )
        {
            // THIS IS A HACK TO DETECT rotating shifters
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = ' '; *pClose = 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            fRotating = 1;
        }
        else
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
            pStr = Wlc_PrsSkipSpaces( pStr );
        }
    }
    if ( Wlc_PrsIsDigit(pStr) )
    {
        int Range, Signed;
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, pXValue );
        if ( pStr == NULL )
            return 0;
        Type = WLC_OBJ_CONST;
    }
    else if ( pStr[0] == '!' || (pStr[0] == '~' && pStr[1] != '&' && pStr[1] != '|' && pStr[1] != '^') || pStr[0] == '@' || pStr[0] == '#' )
    {
        if ( pStr[0] == '!' )
            Type = WLC_OBJ_LOGIC_NOT;
        else if ( pStr[0] == '~' )
            Type = WLC_OBJ_BIT_NOT;
        else if ( pStr[0] == '@' )
            Type = WLC_OBJ_ARI_SQRT;
        else if ( pStr[0] == '#' )
            Type = WLC_OBJ_ARI_SQUARE;
        else assert( 0 );
        // skip parentheses
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( pStr[0] == '(' )
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
        }
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after !." );
    }
    else if ( pStr[0] == '-' || 
              pStr[0] == '&' || pStr[0] == '|' || pStr[0] == '^' || 
              (pStr[0] == '~' && pStr[1] == '&') || 
              (pStr[0] == '~' && pStr[1] == '|') || 
              (pStr[0] == '~' && pStr[1] == '^') )
    {
        int shift = 1;
        if ( pStr[0] == '-' )
            Type = WLC_OBJ_ARI_MINUS;
        else if ( pStr[0] == '&' )
            Type = WLC_OBJ_REDUCT_AND;
        else if ( pStr[0] == '|' )
            Type = WLC_OBJ_REDUCT_OR;
        else if ( pStr[0] == '^' )
            Type = WLC_OBJ_REDUCT_XOR;
        else if ( pStr[0] == '~' && pStr[1] == '&' )
            {Type = WLC_OBJ_REDUCT_NAND; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '|' )
            {Type = WLC_OBJ_REDUCT_NOR; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '^' )
            {Type = WLC_OBJ_REDUCT_NXOR; shift = 2;}
        else assert( 0 );
        if ( !(pStr = Wlc_PrsReadName(p, pStr+shift, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after a unary operator." );
    }
    else if ( pStr[0] == '{' )
    {
        // THIS IS A HACK TO DETECT zero padding AND sign extension
        if ( Wlc_PrsFindSymbol(pStr+1, '{') )
        {
            if ( Wlc_PrsFindSymbol(pStr+1, '\'') )
                Type = WLC_OBJ_BIT_ZEROPAD;
            else
                Type = WLC_OBJ_BIT_SIGNEXT;
            pStr = Wlc_PrsFindSymbol(pStr+1, ',');
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting one comma in this line." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in sign-extension." );
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( pStr[0] != '}' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "There is no closing brace (})." );
        }
        else // concatenation
        {
            while ( 1 )
            {
                pStr = Wlc_PrsSkipSpaces( pStr+1 );
                if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in concatenation." );
                if ( pStr[0] == '}' )
                    break;
                if ( pStr[0] != ',' )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Expected comma (,) in this place." );
            }
            Type = WLC_OBJ_BIT_CONCAT;
        }
        assert( pStr[0] == '}' );
        pStr++;
    }
    else
    {
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return 0;
        // get the next symbol
        if ( pStr[0] == 0 )
            Type = WLC_OBJ_BUF;
        else if ( pStr[0] == '?' )
        {
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            if ( pStr[0] != ':' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "MUX lacks the colon symbol (:)." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            assert( Vec_IntSize(vFanins) == 3 );
            ABC_SWAP( int, Vec_IntArray(vFanins)[1], Vec_IntArray(vFanins)[2] );
            Type = WLC_OBJ_MUX;
        }
        else if ( pStr[0] == '[' )
        {
            int End, Beg; char * pLine = pStr;
            pStr = Wlc_PrsFindRange( pStr, &End, &Beg );
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
            Vec_IntPushTwo( vFanins, End, Beg );
            Type = WLC_OBJ_BIT_SELECT;
        }
        else 
        {
                 if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] != '>' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_R : WLC_OBJ_SHIFT_R;
            else if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] == '>' ) pStr += 3, Type = WLC_OBJ_SHIFT_RA;      
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] != '<' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_L : WLC_OBJ_SHIFT_L;
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] == '<' ) pStr += 3, Type = WLC_OBJ_SHIFT_LA;      
            else if ( pStr[0] == '&' && pStr[1] != '&'                   ) pStr += 1, Type = WLC_OBJ_BIT_AND;       
            else if ( pStr[0] == '|' && pStr[1] != '|'                   ) pStr += 1, Type = WLC_OBJ_BIT_OR;        
            else if ( pStr[0] == '^' && pStr[1] != '^'                   ) pStr += 1, Type = WLC_OBJ_BIT_XOR;       
            else if ( pStr[0] == '~' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_BIT_NAND;       
            else if ( pStr[0] == '~' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_BIT_NOR;       
            else if ( pStr[0] == '~' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_BIT_NXOR;       
            else if ( pStr[0] == '=' && pStr[1] == '>'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_IMPL;     
            else if ( pStr[0] == '&' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_AND;     
            else if ( pStr[0] == '|' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_OR;      
            else if ( pStr[0] == '^' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_XOR;      
            else if ( pStr[0] == '=' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_EQU;      
            else if ( pStr[0] == '!' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_NOTEQU;      
            else if ( pStr[0] == '<' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_LESS;     
            else if ( pStr[0] == '>' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_MORE;     
            else if ( pStr[0] == '<' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_LESSEQU;
            else if ( pStr[0] == '>' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_MOREEQU;  
            else if ( pStr[0] == '+'                                     ) pStr += 1, Type = WLC_OBJ_ARI_ADD;       
            else if ( pStr[0] == '-'                                     ) pStr += 1, Type = WLC_OBJ_ARI_SUB;       
            else if ( pStr[0] == '*' && pStr[1] != '*'                   ) pStr += 1, Type = WLC_OBJ_ARI_MULTI;     
            else if ( pStr[0] == '/'                                     ) pStr += 1, Type = WLC_OBJ_ARI_DIVIDE;        
            else if ( pStr[0] == '%'                                     ) pStr += 1, Type = WLC_OBJ_ARI_REM;   
            else if ( pStr[0] == '*' && pStr[1] == '*'                   ) pStr += 2, Type = WLC_OBJ_ARI_POWER;
            else return Wlc_PrsWriteErrorMessage( p, pStr, "Unsupported operation (%c).", pStr[0] );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( Type == WLC_OBJ_ARI_ADD && pStr[0] == '+' )
            {
                if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                    return 0;
                pStr = Wlc_PrsSkipSpaces( pStr );
            }
            if ( pStr[0] )
                printf( "Warning: Trailing symbols \"%s\" in line %d.\n", pStr, Wlc_PrsFindLine(p, pStr) );
        }
    }
    // make sure there is nothing left there
    if ( pStr )
    {
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr != NULL )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is left at the end of the line.", pName );   
    }
    return Type;
}